

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio_utils.hpp
# Opt level: O2

void setsc<double>(string *entry,double *output)

{
  istream *piVar1;
  FILEIO_Exception *this;
  stringstream local_228 [8];
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::stringstream::stringstream(local_228,(string *)entry,_S_out|_S_in);
  piVar1 = std::istream::_M_extract<double>((double *)local_228);
  if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) == 0) {
    std::__cxx11::stringstream::~stringstream(local_228);
    return;
  }
  this = (FILEIO_Exception *)__cxa_allocate_exception(0x28);
  std::operator+(&local_40,"Error parsing string \'",entry);
  std::operator+(&local_60,&local_40,"\' into type \'");
  std::operator+(&local_80,&local_60,_locale + (*_locale == '*'));
  std::operator+(&local_a0,&local_80,"\'");
  FILEIO_Exception::FILEIO_Exception(this,&local_a0);
  __cxa_throw(this,&FILEIO_Exception::typeinfo,General_Exception::~General_Exception);
}

Assistant:

void setsc(const string& entry, T& output) {
  stringstream ss(entry);
  if(!(ss >> output)) {
    throw(FILEIO_Exception("Error parsing string '" + entry + "' into type '" + typeid(T).name() + "'"));
  }
}